

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_uint16(mg_session *session,uint16_t *val)

{
  ulong uVar1;
  
  uVar1 = session->in_cursor + 2;
  if (session->in_end < uVar1) {
    mg_session_set_error(session,"unexpected end of message");
    return -6;
  }
  *val = *(ushort *)(session->in_buffer + session->in_cursor) << 8 |
         *(ushort *)(session->in_buffer + session->in_cursor) >> 8;
  session->in_cursor = uVar1;
  return 0;
}

Assistant:

int mg_session_read_uint16(mg_session *session, uint16_t *val) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  *val = be16toh(*(uint16_t *)(session->in_buffer + session->in_cursor));
  session->in_cursor += 2;
  return 0;
}